

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O1

void __thiscall EdExplFinder::bfs_shortest_path(EdExplFinder *this)

{
  int iVar1;
  ulong *puVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pdVar7;
  key_type *pkVar8;
  const_iterator cVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  vector<bool,_std::allocator<bool>_> *pvVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar22;
  pair<int,_int> node;
  pair<int,_int> start_node;
  pair<int,_int> currentNode;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  node_set;
  key_type local_a8;
  int local_9c;
  ulong local_98;
  ulong local_90;
  pair<int,_int> local_88;
  vector<int,_std::allocator<int>_> *local_80;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_78;
  key_type local_70;
  ulong local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  pvVar6 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  iVar18 = this->seqSize + 1;
  local_60._M_impl._0_4_ = this->lb + 1;
  std::vector<int,_std::allocator<int>_>::vector
            (pvVar6,(ulong)(uint)(iVar18 * iVar18),(value_type_conflict1 *)&local_60,
             (allocator_type *)&local_88);
  (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(this->seqSize + 2) * this->seqSize] = 0;
  pdVar7 = (deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)operator_new(0x50);
  *(undefined8 *)pdVar7 = 0;
  *(undefined8 *)(pdVar7 + 8) = 0;
  *(undefined8 *)(pdVar7 + 0x10) = 0;
  *(undefined8 *)(pdVar7 + 0x18) = 0;
  *(undefined8 *)(pdVar7 + 0x20) = 0;
  *(undefined8 *)(pdVar7 + 0x28) = 0;
  *(undefined8 *)(pdVar7 + 0x30) = 0;
  *(undefined8 *)(pdVar7 + 0x38) = 0;
  *(undefined8 *)(pdVar7 + 0x40) = 0;
  *(undefined8 *)(pdVar7 + 0x48) = 0;
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_initialize_map
            ((_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pdVar7,0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.first = this->seqSize;
  local_88.second = local_88.first;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (*(undefined8 **)(pdVar7 + 0x30) == (undefined8 *)(*(long *)(pdVar7 + 0x40) + -8)) {
    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    _M_push_back_aux<std::pair<int,int>const&>(pdVar7,&local_88);
  }
  else {
    **(undefined8 **)(pdVar7 + 0x30) = CONCAT44(local_88.first,local_88.first);
    *(long *)(pdVar7 + 0x30) = *(long *)(pdVar7 + 0x30) + 8;
  }
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_insert_unique<std::pair<int,int>const&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&local_60,&local_88);
  local_68 = (long)this->lb / (long)this->min_id_cost & 0xffffffff;
  pkVar8 = *(key_type **)(pdVar7 + 0x10);
  if (*(key_type **)(pdVar7 + 0x30) != pkVar8) {
    local_90 = 0x800000000000003f;
    local_80 = pvVar6;
    local_78 = pdVar7;
    do {
      pvVar6 = local_80;
      local_70 = *pkVar8;
      std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_78);
      pVar22 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::equal_range(&local_60,&local_70);
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::_M_erase_aux(&local_60,(_Base_ptr)pVar22.first._M_node,(_Base_ptr)pVar22.second._M_node);
      pdVar7 = local_78;
      local_98 = (ulong)local_70 & 0xffffffff;
      iVar5 = local_70.second;
      iVar18 = this->seqSize;
      iVar20 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(iVar18 + 1) * local_70.first + local_70.second];
      if (iVar20 < this->lb) {
        iVar1 = local_70.second + -1;
        local_9c = iVar20;
        if (local_70.first - (int)local_68 < local_70.second && 0 < local_70.second) {
          uVar11 = 0;
          if (local_70.second <= iVar18) {
            lVar10 = (long)this->max_char + 1;
            uVar19 = iVar1 * lVar10;
            iVar18 = (iVar18 - local_70.second) + 1;
            do {
              uVar15 = uVar19 + 0x3f;
              if (-1 < (long)uVar19) {
                uVar15 = uVar19;
              }
              if (((this->seq2ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar15 >> 6) +
                    (ulong)((uVar19 & local_90) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar19 & 0x3f) & 1) != 0) {
                uVar11 = 1;
                break;
              }
              uVar19 = uVar19 + lVar10;
              iVar18 = iVar18 + -1;
              uVar11 = 0;
            } while (iVar18 != 0);
          }
          uVar19 = (ulong)(uint)this->max_char;
          if ((int)uVar11 <= this->max_char) {
            uVar15 = (ulong)uVar11;
            do {
              if (uVar15 == 0) {
                iVar18 = 0;
              }
              else {
                iVar18 = this->insertion_cost->data[(int)uVar15 - 1];
              }
              uVar11 = (this->seqSize + 1) * (int)local_98 + iVar1;
              iVar18 = iVar18 + iVar20;
              if (this->dpMatrix->data[uVar11] + iVar18 < this->lb) {
                lVar10 = (uint)(((int)uVar19 + 1) * iVar1) + uVar15;
                uVar13 = (ulong)(int)lVar10;
                uVar19 = uVar13 + 0x3f;
                if (-1 < (long)uVar13) {
                  uVar19 = uVar13;
                }
                puVar2 = (this->seq2ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         ((long)uVar19 >> 6) +
                         (ulong)((uVar13 & local_90) < 0x8000000000000001) + 0xffffffffffffffff;
                *puVar2 = *puVar2 | 1L << ((byte)lVar10 & 0x3f);
              }
              else {
                piVar3 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                iVar20 = piVar3[(int)uVar11];
                if (iVar18 < iVar20) {
                  iVar20 = iVar18;
                }
                piVar3[(int)uVar11] = iVar20;
                local_a8.first = (int)local_98;
                local_a8.second = iVar1;
                cVar9 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_a8);
                iVar20 = local_9c;
                if ((_Rb_tree_header *)cVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  if (*(undefined8 **)(pdVar7 + 0x30) ==
                      (undefined8 *)(*(long *)(pdVar7 + 0x40) + -8)) {
                    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_push_back_aux<std::pair<int,int>const&>(pdVar7,&local_a8);
                  }
                  else {
                    **(undefined8 **)(pdVar7 + 0x30) = CONCAT44(local_a8.second,local_a8.first);
                    *(long *)(pdVar7 + 0x30) = *(long *)(pdVar7 + 0x30) + 8;
                  }
                  std::
                  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  ::_M_insert_unique<std::pair<int,int>const&>
                            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                              *)&local_60,&local_a8);
                  iVar20 = local_9c;
                }
              }
              uVar19 = (ulong)this->max_char;
              bVar4 = (long)uVar15 < (long)uVar19;
              uVar15 = uVar15 + 1;
            } while (bVar4);
          }
        }
        iVar18 = (int)local_98;
        iVar21 = iVar18 + -1;
        if (iVar5 < (int)local_68 + iVar18 && 0 < iVar18) {
          lVar10 = 0;
          if (iVar18 <= this->seqSize) {
            lVar14 = (long)this->max_char + 1;
            uVar19 = iVar21 * lVar14;
            iVar18 = (this->seqSize - iVar18) + 1;
            do {
              uVar15 = uVar19 + 0x3f;
              if (-1 < (long)uVar19) {
                uVar15 = uVar19;
              }
              iVar20 = local_9c;
              if (((this->seq1ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar15 >> 6) +
                    (ulong)((uVar19 & local_90) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar19 & 0x3f) & 1) != 0) {
                lVar10 = 1;
                break;
              }
              uVar19 = uVar19 + lVar14;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar19 = (ulong)(uint)this->max_char;
          if ((int)lVar10 <= this->max_char) {
            do {
              if (lVar10 == 0) {
                iVar18 = 0;
              }
              else {
                iVar18 = this->deletion_cost->data[(int)lVar10 - 1];
              }
              uVar11 = (this->seqSize + 1) * iVar21 + iVar5;
              iVar18 = iVar18 + iVar20;
              if (this->dpMatrix->data[uVar11] + iVar18 < this->lb) {
                lVar14 = (ulong)(uint)(((int)uVar19 + 1) * iVar21) + lVar10;
                uVar15 = (ulong)(int)lVar14;
                uVar19 = uVar15 + 0x3f;
                if (-1 < (long)uVar15) {
                  uVar19 = uVar15;
                }
                puVar2 = (this->seq1ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         ((long)uVar19 >> 6) +
                         (ulong)((uVar15 & local_90) < 0x8000000000000001) + 0xffffffffffffffff;
                *puVar2 = *puVar2 | 1L << ((byte)lVar14 & 0x3f);
              }
              else {
                piVar3 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                iVar20 = piVar3[(int)uVar11];
                if (iVar18 < iVar20) {
                  iVar20 = iVar18;
                }
                piVar3[(int)uVar11] = iVar20;
                local_a8.second = iVar5;
                local_a8.first = iVar21;
                cVar9 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_a8);
                iVar20 = local_9c;
                if ((_Rb_tree_header *)cVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  if (*(undefined8 **)(pdVar7 + 0x30) ==
                      (undefined8 *)(*(long *)(pdVar7 + 0x40) + -8)) {
                    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_push_back_aux<std::pair<int,int>const&>(pdVar7,&local_a8);
                  }
                  else {
                    **(undefined8 **)(pdVar7 + 0x30) = CONCAT44(local_a8.second,local_a8.first);
                    *(long *)(pdVar7 + 0x30) = *(long *)(pdVar7 + 0x30) + 8;
                  }
                  std::
                  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  ::_M_insert_unique<std::pair<int,int>const&>
                            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                              *)&local_60,&local_a8);
                  iVar20 = local_9c;
                }
              }
              uVar19 = (ulong)this->max_char;
              bVar4 = lVar10 < (long)uVar19;
              lVar10 = lVar10 + 1;
            } while (bVar4);
          }
        }
        if (((0 < (int)local_98) && (0 < iVar5)) && (0 < this->max_char)) {
          iVar18 = 0;
          local_98 = local_98 << 4;
          lVar10 = 1;
          do {
            iVar5 = this->max_char;
            if (0 < iVar5) {
              iVar17 = 0;
              do {
                uVar11 = (this->seqSize + 1) * iVar21 + iVar1;
                iVar12 = this->substitution_cost->data[(uint)(iVar18 * iVar5 + iVar17)] + iVar20;
                if (this->dpMatrix->data[uVar11] + iVar12 < this->lb) {
                  lVar14 = *(long *)((long)&this->seq1[-1].var + local_98);
                  if (((lVar10 < *(int *)(lVar14 + 0xc)) || (*(int *)(lVar14 + 0x10) < lVar10)) ||
                     ((*(long *)(lVar14 + 0x28) != 0 &&
                      (*(char *)(*(long *)(lVar14 + 0x28) + lVar10) == '\0')))) {
                    pvVar16 = this->seq1ExcludedCharacters;
                    iVar5 = (iVar5 + 1) * iVar21 + (int)lVar10;
                  }
                  else {
                    pvVar16 = this->seq2ExcludedCharacters;
                    iVar5 = (iVar5 + 1) * iVar1 + iVar17 + 1;
                  }
                  uVar15 = (ulong)iVar5;
                  uVar19 = uVar15 + 0x3f;
                  if (-1 < (long)uVar15) {
                    uVar19 = uVar15;
                  }
                  puVar2 = (pvVar16->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           ((long)uVar19 >> 6) +
                           (ulong)((uVar15 & local_90) < 0x8000000000000001) + 0xffffffffffffffff;
                  *puVar2 = *puVar2 | 1L << ((byte)iVar5 & 0x3f);
                }
                else {
                  piVar3 = (local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar20 = piVar3[(int)uVar11];
                  if (iVar12 < iVar20) {
                    iVar20 = iVar12;
                  }
                  piVar3[(int)uVar11] = iVar20;
                  local_a8.first = iVar21;
                  local_a8.second = iVar1;
                  cVar9 = std::
                          _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                          ::find(&local_60,&local_a8);
                  iVar20 = local_9c;
                  if ((_Rb_tree_header *)cVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
                    if (*(undefined8 **)(local_78 + 0x30) ==
                        (undefined8 *)(*(long *)(local_78 + 0x40) + -8)) {
                      std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      _M_push_back_aux<std::pair<int,int>const&>(local_78,&local_a8);
                    }
                    else {
                      **(undefined8 **)(local_78 + 0x30) = CONCAT44(local_a8.second,local_a8.first);
                      *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 8;
                    }
                    std::
                    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    ::_M_insert_unique<std::pair<int,int>const&>
                              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                                *)&local_60,&local_a8);
                    iVar20 = local_9c;
                  }
                }
                iVar5 = this->max_char;
                iVar17 = iVar17 + 1;
              } while (iVar17 < iVar5);
            }
            iVar18 = iVar18 + 1;
            bVar4 = lVar10 < this->max_char;
            lVar10 = lVar10 + 1;
          } while (bVar4);
        }
      }
      pkVar8 = *(key_type **)(local_78 + 0x10);
      pvVar6 = local_80;
      pdVar7 = local_78;
    } while (*(key_type **)(local_78 + 0x30) != pkVar8);
  }
  piVar3 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  operator_delete(pvVar6);
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
            ((_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)pdVar7);
  operator_delete(pdVar7);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void EdExplFinder::bfs_shortest_path() {
	auto* shortestPathMatrix =
			new std::vector<int>(static_cast<size_t>((seqSize + 1) * (seqSize + 1)), lb + 1);
	// set shortest path for bottom right position to 0 cost
	(*shortestPathMatrix)[matrixCoord(seqSize, seqSize)] = 0;

	auto* nodeQueue = new std::queue<std::pair<int, int> >();
	std::set<std::pair<int, int> > node_set;
	// start with bottom right position
	const std::pair<int, int> start_node = std::pair<int, int>(seqSize, seqSize);
	nodeQueue->push(start_node);
	node_set.insert(start_node);

	// d = distance to diagonal that should be calculated in the matrix
	const int d = lb / min_id_cost;

	while (!nodeQueue->empty()) {
		const std::pair<int, int> currentNode = nodeQueue->front();
		nodeQueue->pop();
		node_set.erase(currentNode);

		const int i = currentNode.first;
		const int j = currentNode.second;

		const int s_ij = (*shortestPathMatrix)[matrixCoord(i, j)];

		if (s_ij >= lb) {
			continue;
		}

		//
		// process move to the left
		//
		if (j - 1 >= 0 && j - 1 >= i - d) {
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			int cj_start = 0;
			for (int k = j - 1; k < seqSize; k++) {
				if ((*seq2ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					cj_start = 1;
					break;
				}
			}
			for (int c = cj_start; c <= max_char; c++) {
				const int ins_cost = c == 0 ? 0 : (*insertion_cost)[c - 1];
				const int d_ij_minus_1 = (*dpMatrix)[matrixCoord(i, j - 1)];
				if (d_ij_minus_1 + ins_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_ij_minus_1 = (*shortestPathMatrix)[matrixCoord(i, j - 1)];
					(*shortestPathMatrix)[matrixCoord(i, j - 1)] = std::min(s_ij_minus_1, s_ij + ins_cost);

					const std::pair<int, int> node = std::pair<int, int>(i, j - 1);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process upwards move
		//
		if (i - 1 >= 0 && j < i + d) {
			int ci_start = 0;
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			for (int k = i - 1; k < seqSize; k++) {
				if ((*seq1ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					ci_start = 1;
					break;
				}
			}
			for (int c = ci_start; c <= max_char; c++) {
				const int del_cost = c == 0 ? 0 : (*deletion_cost)[c - 1];
				const int d_i_minus_1_j = (*dpMatrix)[matrixCoord(i - 1, j)];
				if (d_i_minus_1_j + del_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_i_minus_1_j = (*shortestPathMatrix)[matrixCoord(i - 1, j)];
					(*shortestPathMatrix)[matrixCoord(i - 1, j)] = std::min(s_i_minus_1_j, s_ij + del_cost);

					const std::pair<int, int> node = std::pair<int, int>(i - 1, j);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process diagonal move
		//
		if (i - 1 >= 0 && j - 1 >= 0) {
			for (int c1 = 1; c1 <= max_char; c1++) {
				for (int c2 = 1; c2 <= max_char; c2++) {
					const int d_i_minus_1_j_minus_1 = (*dpMatrix)[matrixCoord(i - 1, j - 1)];
					const int subst_cost = (*substitution_cost)[substCoord(c1, c2)];

					if (d_i_minus_1_j_minus_1 + subst_cost + s_ij < lb) {
						// we can either exclude the character for seq1 or seq2
						if (seq1[i - 1].indomain(c1)) {
							// if seq1 contains c1, we exclude c2 from seq2
							(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c2)] = true;
						} else {
							// if seq2 contains c2, or neither seq1/seq2 contain c1/c2 we exclude c1 from seq1
							(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c1)] = true;
						}
					} else {
						const int s_i_minus_1_j_minus_1 = (*shortestPathMatrix)[matrixCoord(i - 1, j - 1)];
						(*shortestPathMatrix)[matrixCoord(i - 1, j - 1)] =
								std::min(s_i_minus_1_j_minus_1, s_ij + subst_cost);

						const std::pair<int, int> node = std::pair<int, int>(i - 1, j - 1);
						if (node_set.count(node) == 0) {
							nodeQueue->push(node);
							node_set.insert(node);
						}
					}
				}
			}
		}
	}

#ifndef NDEBUG
	debug_print(shortestPathMatrix);
#endif

	delete shortestPathMatrix;
	delete nodeQueue;
}